

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O3

void tst_layoutnode_horizontal_grid(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  RectangleNode *pRVar3;
  RectangleNode *pRVar4;
  RectangleNode *pRVar5;
  Node *this;
  Node *child;
  ostream *poVar6;
  byte bVar7;
  int i;
  long lVar8;
  float fVar9;
  float fVar10;
  RectangleNode *local_c8;
  RectangleNode *r [4];
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  this = &rengine::LayoutNode::create()->super_Node;
  bVar7 = *(byte *)((long)&this[1].m_next + 4);
  if ((bVar7 & 4) == 0) {
    bVar7 = bVar7 | 4;
    *(byte *)((long)&this[1].m_next + 4) = bVar7;
  }
  if ((bVar7 & 3) != 0) {
    *(byte *)((long)&this[1].m_next + 4) = bVar7 & 0xfc;
    rengine::Signal<>::emit(&rengine::LayoutNode::onLayoutTypeChanged,&this->super_SignalEmitter);
  }
  lVar8 = 0;
  do {
    child = (Node *)rengine::RectangleNode::create();
    r[lVar8 + -1] = (RectangleNode *)child;
    rengine::Node::append(this,child);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_0010c535:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00124c36:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00124c36;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0010c535;
  }
  pRVar3 = r[0];
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0010c83a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00124c55:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00124c55;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0010c83a;
  }
  pRVar4 = r[1];
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0010cb47:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00124c74:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00124c74;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 30.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_0010cb47;
  }
  pRVar5 = r[2];
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 30.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_0010ce4e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00124c93:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x8e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 40.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00124c93;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 40.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0010ce4e;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0010d171:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00124cb2:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x90,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00124cb2;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0010d171;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0010d45f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00124cd1:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x91,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_00124cd1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_0010d45f;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_0010d75c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00124cf0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x92,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_00124cf0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_0010d75c;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -40.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0010da5c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -40.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00124d0f:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x93,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_00124d0f;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_0010da5c;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0010dd7b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00124d2e:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x95,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00124d2e;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0010dd7b;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0010e069:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00124d4d:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x96,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_00124d4d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0010e069;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0010e366:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00124d6c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x97,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00124d6c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0010e366;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -40.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0010e666:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -40.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00124d8b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x98,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00124d8b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0010e666;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0010e989:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00124daa:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_00124daa;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0010e989;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0010ec7b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00124dc9:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00124dc9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0010ec7b;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0010ef78:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00124de8:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00124de8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 30.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0010ef78;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 30.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0010f278:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 30.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00124e07:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x9d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 40.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_00124e07;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 40.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0010f278;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,0,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0010f5a6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00124e26:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00124e26;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0010f5a6;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0010f8a7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00124e45:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00124e45;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_0010f8a7;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 25.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_0010fbae:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 25.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00124e64:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 35.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00124e64;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 35.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0010fbae;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 37.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0010feb8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 37.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00124e83:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00124e83;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0010feb8;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,0,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_001101ef:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00124ea2:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00124ea2;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_001101ef;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_001104f0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00124ec1:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10)))
    goto LAB_00124ec1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_001104f0;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -35.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_001107f7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -35.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00124ee0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_00124ee0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_001107f7;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -47.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00110b01:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -47.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00124eff:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xa9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -37.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_00124eff;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -37.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10)))
    goto LAB_00110b01;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,0,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00110e38:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00124f1e:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xab,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00124f1e;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00110e38;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00111139:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00124f3d:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xac,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00124f3d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00111139;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -35.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00111440:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -35.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00124f5c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xad,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00124f5c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -25.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10)))
    goto LAB_00111440;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -47.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_0011174a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -47.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00124f7b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xae,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -37.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10)))
    goto LAB_00124f7b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -37.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_0011174a;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,0,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00111a81:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00124f9a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb0,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00124f9a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00111a81;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00111d82:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00124fb9:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00124fb9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00111d82;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 25.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00112089:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 25.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00124fd8:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 35.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00124fd8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 35.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00112089;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 37.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00112393:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 37.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00124ff7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00124ff7;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00112393;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001126c6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125016:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125016;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_001126c6;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001129bb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125035:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00125035;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_001129bb;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00112cb8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125054:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xb9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125054;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00112cb8;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00112fb8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00125073:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xba,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 40.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125073;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 40.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00112fb8;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,20.0,0.0,0.0,1,4,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001132e4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00125092:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00125092;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_001132e4;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001135d2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001250b1:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_001250b1;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_001135d2;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001138cf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001250d0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_001250d0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_001138cf;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -40.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00113bcf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -40.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001250ef:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xbf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_001250ef;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_00113bcf;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00113ef7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012510e:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc1,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012510e;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00113ef7;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001141e5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012512d:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012512d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_001141e5;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_001144e2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -30.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012514c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0012514c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001144e2;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -40.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001147e2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -40.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012516b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-40, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012516b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001147e2;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,40.0,-20.0,0.0,0.0,1,4,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00114b0e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0012518a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc6,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012518a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_00114b0e;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00114e00:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001251a9:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,199,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_001251a9;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00114e00;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001150fd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_001251c8:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,200,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001251c8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001150fd;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001153fd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(30.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 30.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001251e7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(30, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xc9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 40.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001251e7;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 40.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_001153fd;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00115734:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00125206:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcd,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00125206;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00115734;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00115a35:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00125225:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xce,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00125225;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00115a35;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 25.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00115d3c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 25.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00125244:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xcf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 35.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00125244;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 35.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00115d3c;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 37.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00116046:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 37.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00125263:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 47.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00125263;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00116046;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,22.0,0.0,0.0,1,4,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0011638a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00125282:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd2,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00125282;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0011638a;
  }
  pRVar3 = r[0];
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0011669b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_001252a1:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd3,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_001252a1;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10)))
    goto LAB_0011669b;
  }
  pRVar4 = r[1];
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -35.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_001169b2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -35.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_001252c0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd4,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -25.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10)))
    goto LAB_001252c0;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_001169b2;
  }
  pRVar5 = r[2];
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -47.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00116cc3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -47.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_001252df:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -37.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_001252df;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -37.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_00116cc3;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00117000:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001252fe:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd7,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_001252fe;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00117000;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00117301:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_0012531d:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10)))
    goto LAB_0012531d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00117301;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -35.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00117608:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -35.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_0012533c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-35, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xd9,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_0012533c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -25.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00117608;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -47.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00117912:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -47.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_0012535b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-47, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xda,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -37.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_0012535b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -37.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10)))
    goto LAB_00117912;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,48.0,-22.0,0.0,0.0,1,4,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00117c4f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_0012537a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdc,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_0012537a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00117c4f;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00117f50:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00125399:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00125399;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00117f50;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 25.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00118257:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(25.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(35.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 25.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001253b8:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(25, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xde,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 35.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_001253b8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 35.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00118257;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 37.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00118561:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(37.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(47.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 37.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001253d7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(37, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xdf,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 47.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_001253d7;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 47.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00118561;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00118891:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001253f6:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe5,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_001253f6;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00118891;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00118b86:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00125415:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125415;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_00118b86;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_00118e83:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00125434:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 40.0)) || (NAN(fVar10))) goto LAB_00125434;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_00118e83;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00119188:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_00125453:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xe8,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_00125453;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_00119188;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_001194b7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125472:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xea,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125472;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_001194b7;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001197a5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125491:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xeb,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_00125491;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_001197a5;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00119aa2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_001254b0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xec,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_001254b0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_00119aa2;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00119da6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_001254cf:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xed,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10)))))
    goto LAB_001254cf;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 40.0)) || (NAN(fVar10)))
    goto LAB_00119da6;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0011a0d1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001254ee:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xef,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_001254ee;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0011a0d1;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0011a3bf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012550d:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf0,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012550d;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0011a3bf;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0011a6bc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0012552c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf1,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) goto LAB_0012552c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) goto LAB_0011a6bc;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_0011a9c0:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0012554b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf2,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10)))
    goto LAB_0012554b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_0011a9c0;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0011acef:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_0012556a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf4,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0012556a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_0011acef;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0011afe1:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00125589:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf5,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00125589;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0011afe1;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_0011b2de:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_001255a8:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf6,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10)))
    goto LAB_001255a8;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_0011b2de;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0011b5e3:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_001255c7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xf7,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_001255c7;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_0011b5e3;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,20.0,0,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0011b91d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_001255e6:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfb,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_001255e6;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_0011b91d;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_0011bc1e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00125605:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfc,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00125605;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0011bc1e;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_0011bf25:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_00125624:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfd,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00125624;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_0011bf25;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_0011c22f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_00125643:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0xfe,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00125643;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != 43.0)) || (NAN(fVar10))) goto LAB_0011c22f;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,20.0,0,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_0011c569:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00125662:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x100,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00125662;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_0011c569;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0011c86a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00125681:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x101,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_00125681;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_0011c86a;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_0011cb71:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_001256a0:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x102,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_001256a0;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != 43.0)) || (NAN(fVar10))) goto LAB_0011cb71;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_0011ce7b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_001256bf:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x103,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != 43.0)) || (NAN(fVar10)))
    goto LAB_001256bf;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10)))))
    goto LAB_0011ce7b;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,-10.0,-20.0,0,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_0011d1b5:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_001256de:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x105,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_001256de;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_0011d1b5;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_0011d4b6:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001256fd:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x106,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_001256fd;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10)))
    goto LAB_0011d4b6;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_0011d7bd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_0012571c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x107,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != -23.0)) || (NAN(fVar10)))
    goto LAB_0012571c;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_0011d7bd;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_0011dac7:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_0012573b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x108,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_0012573b;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_0011dac7;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,0.0,0.0,10.0,-20.0,0,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_0011de01:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_0012575a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10a,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_0012575a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_0011de01;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_0011e102:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00125779:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10b,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00125779;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_0011e102;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_0011e409:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_00125798:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_00125798;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_0011e409;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_0011e713:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_001257b7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x10d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_001257b7;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != -23.0)) || (NAN(fVar10)))
    goto LAB_0011e713;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_0011ea46:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001257d6:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x111,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) goto LAB_001257d6;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0011ea46;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0011ed3b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_001257f5:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x112,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_001257f5;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0011ed3b;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_0011f038:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00125814:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x113,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_00125814;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 40.0)) || (NAN(fVar10))) goto LAB_0011f038;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_0011f33d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00125833:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x114,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != 40.0)) || (NAN(fVar10))) goto LAB_00125833;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_0011f33d;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,40.0,0.0,0.0,2,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0011f66f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
LAB_00125852:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x116,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_00125852;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) goto LAB_0011f66f;
  }
  uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_0011f95d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) {
LAB_00125871:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, 0, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x117,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10)))))
    goto LAB_00125871;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar3->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10)))
    goto LAB_0011f95d;
  }
  uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_0011fc5a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_00125890:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x118,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 40.0)) || (NAN(fVar10))) goto LAB_00125890;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar4->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10))))) goto LAB_0011fc5a;
  }
  uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != 20.0 || (NAN(fVar10))))) {
LAB_0011ff5e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != 20.0)) || (NAN(fVar10))) {
LAB_001258af:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, 20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x119,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10)))))
    goto LAB_001258af;
  }
  else {
    uVar1 = *(undefined8 *)&(pRVar5->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 40.0 || (NAN(fVar10)))))
    goto LAB_0011ff5e;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_00120293:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_001258ce:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11b,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001258ce;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_00120293;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00120591:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_98 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_94 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_94);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_001258ed:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-20, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11c,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_001258ed;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00120591;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0012089e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_88 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_84 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_0012590c:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) goto LAB_0012590c;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) goto LAB_0012089e;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_00120ba9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -20.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_0012592b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-20, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x11e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_0012592b;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10)))
    goto LAB_00120ba9;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,20.0,-40.0,0.0,0.0,2,2,0.0,0.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00120edb:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_0012594a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 0, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x120,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) goto LAB_0012594a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00120edb;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10))))) {
LAB_001211cd:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10))) {
LAB_00125969:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(10, -20, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x121,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_00125969;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != 0.0 || (NAN(fVar10))))) goto LAB_001211cd;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_001214ca:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(0.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 0.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_00125988:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 0, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x122,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_00125988;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10)))
    goto LAB_001214ca;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 10.0) || (NAN(fVar9))) || (fVar10 != -40.0)) || (NAN(fVar10))) {
LAB_001217cf:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-40.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-20.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 10.0) || (NAN(fVar9))) || ((fVar10 != -40.0 || (NAN(fVar10))))) {
LAB_001259a7:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(10, -40, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x123,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 20.0) || (NAN(fVar9))) || (fVar10 != -20.0)) || (NAN(fVar10)))
    goto LAB_001259a7;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 20.0) || (NAN(fVar9))) || ((fVar10 != -20.0 || (NAN(fVar10)))))
    goto LAB_001217cf;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00121b0c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_001259c6:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x127,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_001259c6;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00121b0c;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00121e0d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_001259e5:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x128,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_001259e5;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_00121e0d;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_00122114:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_00125a04:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x129,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != 43.0)) || (NAN(fVar10))) goto LAB_00125a04;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00122114;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_0012241e:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 13.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_00125a23:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12a,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00125a23;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_0012241e;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,44.0,0.0,0.0,2,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_0012275b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00125a42:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,300,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10))))) goto LAB_00125a42;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10))) goto LAB_0012275b;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != 1.0)) || (NAN(fVar10))) {
LAB_00122a5c:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 1.0 || (NAN(fVar10))))) {
LAB_00125a61:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, 1, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12d,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != 21.0)) || (NAN(fVar10)))
    goto LAB_00125a61;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 21.0 || (NAN(fVar10)))))
    goto LAB_00122a5c;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_00122d63:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != 23.0)) || (NAN(fVar10))) {
LAB_00125a80:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12e,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00125a80;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10))))) goto LAB_00122d63;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_0012306d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != 23.0 || (NAN(fVar10))))) {
LAB_00125a9f:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, 23, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x12f,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != 43.0 || (NAN(fVar10)))))
    goto LAB_00125a9f;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != 43.0)) || (NAN(fVar10)))
    goto LAB_0012306d;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,-24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_001233aa:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00125abe:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh(-11, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x131,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_00125abe;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_001233aa;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -23.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001236ab:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00125add:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(-23, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x132,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_00125add;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10)))))
    goto LAB_001236ab;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != -11.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_001239b2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -11.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_00125afc:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh(-11, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x133,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -1.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_00125afc;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -1.0) || (NAN(fVar9))) || (fVar10 != -23.0)) || (NAN(fVar10)))
    goto LAB_001239b2;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_00123cbc:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(-13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -23.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_00125b1b:
      __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(-23, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x134,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != -13.0) || (NAN(fVar9))) || (fVar10 != -23.0)) || (NAN(fVar10)))
    goto LAB_00125b1b;
  }
  else {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != -13.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_00123cbc;
  }
  apply_w_h_cw_ch_r_c_m_s((LayoutNode *)this,24.0,-44.0,0.0,0.0,2,2,1.0,2.0);
  fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
  fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
  if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00123ff9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)((long)local_c8 + 0x34);
    uVar2 = *(undefined8 *)((long)local_c8 + 0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_58 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_54 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x34);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x34) >> 0x20);
    if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -21.0)) || (NAN(fVar10))) {
LAB_00125b3a:
      __assert_fail("(r[0]->geometry()) == (rect2d::fromXywh( 1, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x136,"void tst_layoutnode_horizontal_grid()");
    }
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00125b3a;
  }
  else {
    fVar9 = (float)*(undefined8 *)((long)local_c8 + 0x3c);
    fVar10 = (float)((ulong)*(undefined8 *)((long)local_c8 + 0x3c) >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00123ff9;
  }
  uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_001242fa:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_48 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_44 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(13.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-21.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 13.0) || (NAN(fVar9))) || ((fVar10 != -21.0 || (NAN(fVar10))))) {
LAB_00125b59:
      __assert_fail("(r[1]->geometry()) == (rect2d::fromXywh(13, -21, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x137,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 23.0) || (NAN(fVar9))) || ((fVar10 != -1.0 || (NAN(fVar10))))) goto LAB_00125b59;
  }
  else {
    uVar1 = *(undefined8 *)&(r[0]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 23.0) || (NAN(fVar9))) || (fVar10 != -1.0)) || (NAN(fVar10))) goto LAB_001242fa;
  }
  uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 != 1.0) || (NAN(fVar9))) || (fVar10 != -43.0)) || (NAN(fVar10))) {
LAB_00124601:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    uVar2 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_68 = (float)uVar1;
    poVar6 = std::ostream::_M_insert<double>((double)local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_64 = (float)((ulong)uVar1 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    local_78 = (float)uVar2;
    poVar6 = std::ostream::_M_insert<double>((double)local_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    fStack_74 = (float)((ulong)uVar2 >> 0x20);
    poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(1.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-43.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
    poVar6 = std::ostream::_M_insert<double>(11.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<double>(-23.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).super_Node.field_0x34;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 1.0) || (NAN(fVar9))) || ((fVar10 != -43.0 || (NAN(fVar10))))) {
LAB_00125b78:
      __assert_fail("(r[2]->geometry()) == (rect2d::fromXywh( 1, -43, 10, 20))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                    ,0x138,"void tst_layoutnode_horizontal_grid()");
    }
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if ((((fVar9 != 11.0) || (NAN(fVar9))) || (fVar10 != -23.0)) || (NAN(fVar10)))
    goto LAB_00125b78;
  }
  else {
    uVar1 = *(undefined8 *)&(r[1]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 != 11.0) || (NAN(fVar9))) || ((fVar10 != -23.0 || (NAN(fVar10)))))
    goto LAB_00124601;
  }
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if (((fVar9 == 13.0) && (!NAN(fVar9))) && ((fVar10 == -43.0 && (!NAN(fVar10))))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 == 23.0) && (!NAN(fVar9))) && ((fVar10 == -23.0 && (!NAN(fVar10)))))
    goto LAB_00124bc2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not equal \'",0xb);
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  uVar2 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  local_68 = (float)uVar1;
  poVar6 = std::ostream::_M_insert<double>((double)local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  fStack_64 = (float)((ulong)uVar1 >> 0x20);
  poVar6 = std::ostream::_M_insert<double>((double)fStack_64);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  local_78 = (float)uVar2;
  poVar6 = std::ostream::_M_insert<double>((double)local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  fStack_74 = (float)((ulong)uVar2 >> 0x20);
  poVar6 = std::ostream::_M_insert<double>((double)fStack_74);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\' vs \'",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rect2d(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  poVar6 = std::ostream::_M_insert<double>(13.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<double>(-43.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vec2(",5);
  poVar6 = std::ostream::_M_insert<double>(23.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<double>(-23.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).super_Node.field_0x34;
  fVar9 = (float)uVar1;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  if ((((fVar9 == 13.0) && (!NAN(fVar9))) && (fVar10 == -43.0)) && (!NAN(fVar10))) {
    uVar1 = *(undefined8 *)&(r[2]->super_RectangleNodeBase).field_0x3c;
    fVar9 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    if (((fVar9 == 23.0) && (!NAN(fVar9))) && ((fVar10 == -23.0 && (!NAN(fVar10))))) {
LAB_00124bc2:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"void tst_layoutnode_horizontal_grid()",0x25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ok",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      (*(this->super_SignalEmitter)._vptr_SignalEmitter[2])();
      return;
    }
  }
  __assert_fail("(r[3]->geometry()) == (rect2d::fromXywh(13, -43, 10, 20))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_layout.cpp"
                ,0x139,"void tst_layoutnode_horizontal_grid()");
}

Assistant:

void tst_layoutnode_horizontal_grid()
{
    LayoutNode *root = LayoutNode::create();
    root->setActivationMode(LayoutNode::Explicit);
    root->setLayoutType(LayoutEngine::Grid_Horizontal);

    RectangleNode *r[4];
    for (int i=0; i<4; ++i) {
        r[i] = RectangleNode::create();
        root->append(r[i]);
    }

    // cellsize, one row
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // cellsize, margin/spacing
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 0, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // width/height, 1x4 grid
    apply_w_h_cw_ch_r_c_m_s(root, 40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, 20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, 0, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, 0, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-30, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-40, -20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 40, -20, 0, 0, 1, 4, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(20, -20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(30, -20, 10, 20));

    // width/height, 1x4 grid, space/margin
    apply_w_h_cw_ch_r_c_m_s(root, 48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, 22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, 1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, 1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, 1, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, 1, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-35, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-47, -21, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 48, -22, 0, 0, 1, 4, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(25, -21, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(37, -21, 10, 20));

    // And then all the same tests, but this time limited to 2 columns

    // cell size, 2 columns
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, 0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, 0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // cell size, space/margin, 2 cols
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, 20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, -10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 0, 0, 10, -20, 0, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, 40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10,  0, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20,  0, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, 20, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, 20, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-10, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-20, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-10, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-20, -40, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 20, -40, 0, 0, 2, 2, 0, 0);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 0, -20, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(10, -20, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 0, -40, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(10, -40, 10, 20));

    // width/height, 2x2 grid
    apply_w_h_cw_ch_r_c_m_s(root, 24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, 44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11,  1, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23,  1, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, 23, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, 23, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, -24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh(-11, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(-23, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh(-11, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(-23, -43, 10, 20));
    apply_w_h_cw_ch_r_c_m_s(root, 24, -44, 0, 0, 2, 2, 1, 2);
    check_equal(r[0]->geometry(), rect2d::fromXywh( 1, -21, 10, 20));
    check_equal(r[1]->geometry(), rect2d::fromXywh(13, -21, 10, 20));
    check_equal(r[2]->geometry(), rect2d::fromXywh( 1, -43, 10, 20));
    check_equal(r[3]->geometry(), rect2d::fromXywh(13, -43, 10, 20));


    cout << __PRETTY_FUNCTION__ << ": ok" << endl;

    root->destroy();
}